

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Transmitter_PDU::GetAntennaPattern(Transmitter_PDU *this,KOCTET *AP,KUINT16 Length)

{
  KOCTET *pKVar1;
  KOCTET *pKVar2;
  KException *this_00;
  KString local_40;
  
  if (this->m_ui16AntennaPatternLength <= Length) {
    pKVar1 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pKVar2 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
      *AP = *pKVar2;
      AP = AP + 1;
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GetAntennaPattern","");
  KException::KException(this_00,&local_40,1);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Transmitter_PDU::GetAntennaPattern(KOCTET *AP, KUINT16 Length) const noexcept(false)
{
    if( Length < m_ui16AntennaPatternLength )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    vector<KOCTET>::const_iterator citr = m_vAntennaPattern.begin();
    vector<KOCTET>::const_iterator citrEnd = m_vAntennaPattern.end();
    for( ; citr != citrEnd; ++citr, ++AP )
    {
        *AP = *citr;
    }
}